

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexical.cc
# Opt level: O0

bool __thiscall lexical::analyse_string(lexical *this,iterator *it,Meta *m)

{
  bool bVar1;
  int iVar2;
  reference pcVar3;
  Symbol local_150;
  undefined1 local_128 [8];
  Token t;
  string local_f0;
  undefined1 local_d0 [8];
  anon_class_24_3_f8a86dc3 init;
  string local_b0;
  undefined4 local_90;
  allocator local_89;
  string local_88;
  iterator local_58;
  int countO;
  int countU;
  string buf;
  int state;
  Meta *m_local;
  iterator *it_local;
  lexical *this_local;
  
  buf.field_2._12_4_ = 0;
  std::__cxx11::string::string((string *)&countO);
  local_58._M_current._4_4_ = 0;
  local_58._M_current._0_4_ = 0;
  do {
    bVar1 = __gnu_cxx::operator!=(it,&m->end);
    if (!bVar1) {
      this_local._7_1_ = false;
      local_90 = 1;
LAB_001220aa:
      std::__cxx11::string::~string((string *)&countO);
      return this_local._7_1_;
    }
    switch(buf.field_2._12_4_) {
    case 0:
      buf.field_2._12_4_ = 1;
      break;
    case 1:
      pcVar3 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(it);
      if (*pcVar3 == '\\') {
        buf.field_2._12_4_ = 2;
        __gnu_cxx::
        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator*(it);
        std::__cxx11::string::push_back((char)&countO);
      }
      else {
        pcVar3 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(it);
        if (*pcVar3 == '\"') {
          buf.field_2._12_4_ = 5;
        }
        else {
          __gnu_cxx::
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator*(it);
          std::__cxx11::string::push_back((char)&countO);
        }
      }
      break;
    case 2:
      __gnu_cxx::
      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator*(it);
      std::__cxx11::string::push_back((char)&countO);
      pcVar3 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(it);
      bVar1 = Table::in_escape_chars(&this->table,pcVar3);
      if (bVar1) {
        buf.field_2._12_4_ = 1;
      }
      else {
        pcVar3 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(it);
        if (*pcVar3 == 'u') {
          buf.field_2._12_4_ = 3;
        }
        else {
          pcVar3 = __gnu_cxx::
                   __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(it);
          bVar1 = sutil::is_octal(pcVar3);
          if (!bVar1) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_88,anon_var_dwarf_20ac5,&local_89);
            error(this,it,m,&local_88);
            std::__cxx11::string::~string((string *)&local_88);
            std::allocator<char>::~allocator((allocator<char> *)&local_89);
            this_local._7_1_ = false;
            local_90 = 1;
            goto LAB_001220aa;
          }
          __gnu_cxx::
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator--(it);
          std::__cxx11::string::pop_back();
          buf.field_2._12_4_ = 4;
        }
      }
      break;
    case 3:
      if (local_58._M_current._4_4_ < 4) {
        local_58._M_current._4_4_ = local_58._M_current._4_4_ + 1;
        pcVar3 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(it);
        iVar2 = isxdigit((int)*pcVar3);
        if (iVar2 == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_b0,anon_var_dwarf_20ad0,(allocator *)((long)&init.state + 7));
          error(this,it,m,&local_b0);
          std::__cxx11::string::~string((string *)&local_b0);
          std::allocator<char>::~allocator((allocator<char> *)((long)&init.state + 7));
          this_local._7_1_ = false;
          local_90 = 1;
          goto LAB_001220aa;
        }
        __gnu_cxx::
        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator*(it);
        std::__cxx11::string::push_back((char)&countO);
      }
      else {
        local_58._M_current._4_4_ = local_58._M_current._4_4_ + 1;
        __gnu_cxx::
        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator--(it);
        local_58._M_current._4_4_ = 0;
        buf.field_2._12_4_ = 1;
      }
      break;
    case 4:
      init.it = &local_58;
      init.countO = (int *)(buf.field_2._M_local_buf + 0xc);
      local_d0 = (undefined1  [8])it;
      if ((int)local_58._M_current < 3) {
        local_58._M_current._0_4_ = (int)local_58._M_current + 1;
        pcVar3 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(it);
        bVar1 = sutil::is_octal(pcVar3);
        if (bVar1) {
          local_58._M_current._0_4_ = (int)local_58._M_current + 1;
          __gnu_cxx::
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator*(it);
          std::__cxx11::string::push_back((char)&countO);
        }
        else {
          if ((int)local_58._M_current == 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_f0,anon_var_dwarf_20ae7,
                       (allocator *)(t.name.field_2._M_local_buf + 0xf));
            error(this,it,m,&local_f0);
            std::__cxx11::string::~string((string *)&local_f0);
            std::allocator<char>::~allocator((allocator<char> *)(t.name.field_2._M_local_buf + 0xf))
            ;
            this_local._7_1_ = false;
            local_90 = 1;
            goto LAB_001220aa;
          }
          analyse_string::anon_class_24_3_f8a86dc3::operator()((anon_class_24_3_f8a86dc3 *)local_d0)
          ;
        }
      }
      else {
        local_58._M_current._0_4_ = (int)local_58._M_current + 1;
        analyse_string::anon_class_24_3_f8a86dc3::operator()((anon_class_24_3_f8a86dc3 *)local_d0);
      }
      break;
    case 5:
      Token::Token((Token *)local_128,m->line,m->column,6,(string *)&countO);
      std::vector<Token,_std::allocator<Token>_>::push_back(&this->tokens,(value_type *)local_128);
      Symbol::Symbol(&local_150,t.row,(string *)&t.type);
      std::set<Symbol,_std::less<Symbol>,_std::allocator<Symbol>_>::insert
                (&this->symbols,&local_150);
      Symbol::~Symbol(&local_150);
      this_local._7_1_ = true;
      local_90 = 1;
      Token::~Token((Token *)local_128);
      goto LAB_001220aa;
    }
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(it);
  } while( true );
}

Assistant:

bool lexical::analyse_string(string::iterator &it, const Meta &m) {
    int state = 0;
    string buf;

    //判断是否是需要转义的字符
    int countU = 0;
    int countO = 0;
    while (it != m.end) {
        switch (state) {
            case 0: {
                state = 1;
                break;
            }
                //分析普通字符
            case 1: {
                if (*it == '\\') {
                    state = 2;
                    buf.push_back(*it);
                } else if (*it == '"')
                    state = 5;
                else
                    buf.push_back(*it);

                break;
            }
                //分析普通转义字符
            case 2: {
                buf.push_back(*it);
                if (table.in_escape_chars(*it)) {
                    state = 1;
                } else if (*it == 'u') {
                    state = 3;
                } else if (sutil::is_octal(*it)) {
                    --it;
                    buf.pop_back();
                    state = 4;
                } else {
                    error(it, m, "非法的转义字符");
                    return false;
                }
                break;
            }
                //分析 \uFFFF
            case 3: {
                if (countU++ < 4) {
                    if (isxdigit(*it))buf.push_back(*it);
                    else {
                        error(it, m, "unicode表示法需要4位16进制数");
                        return false;
                    }
                } else {
                    --it;
                    countU = 0;
                    state = 1;
                }
                break;
            }
                // 分析\八进制*3
            case 4: {
                auto init = [&it, &countO, &state]() -> void {
                    --it;
                    countO = 0;
                    state = 1;
                };
                if (countO++ < 3) {
                    if (sutil::is_octal(*it)) {
                        ++countO;
                        buf.push_back(*it);
                    } else if (countO != 0) {
                        init();
                    } else {
                        error(it, m, "八进制字符需要1-3位八进制数");
                        return false;
                    }
                } else
                    init();

                break;
            }
            case 5: {
                Token t(m.line, m.column, Token::STRING, buf);
                tokens.push_back(t);
                symbols.insert(Symbol(t.type, t.name));
                return true;
            }
        }
        ++it;
    }
    return false;
}